

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool httplib::detail::read_content<httplib::Response>
               (Stream *strm,Response *x,size_t payload_max_length,int *status,Progress *progress,
               ContentReceiver *receiver)

{
  Headers *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  const_iterator cVar5;
  key_type *pkVar6;
  ulong uVar7;
  ContentReceiver *out;
  bool bVar8;
  key_type *pkVar9;
  char *pcVar10;
  _Rb_tree_header *p_Var11;
  key_type *pkVar12;
  size_type __dnew;
  char buf [4096];
  key_type *local_1118;
  key_type *local_1110 [2];
  undefined1 local_1100 [32];
  code *local_10e0;
  code *local_10d8;
  Progress *local_10d0;
  key_type *local_10c8;
  int *local_10c0;
  _Any_data local_10b8;
  code *local_10a8;
  code *local_10a0;
  _Any_data local_1098;
  code *local_1088;
  code *local_1080;
  _Any_data local_1078;
  code *local_1068;
  code *local_1060;
  _Any_data local_1058;
  code *local_1048;
  key_type local_1038 [128];
  
  local_1100._24_8_ = 0;
  local_10d8 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/httplib/httplib.h:1828:25)>
               ::_M_invoke;
  local_10e0 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/httplib/httplib.h:1828:25)>
               ::_M_manager;
  paVar1 = &local_1038[0].field_2;
  local_1100._16_8_ = receiver;
  local_10c8 = (key_type *)payload_max_length;
  local_10c0 = status;
  local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"Content-Encoding","");
  this = &x->headers;
  cVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this->_M_t,local_1038);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1038[0]._M_dataplus._M_p,
                    (ulong)(local_1038[0].field_2._M_allocated_capacity + 1));
  }
  p_Var11 = &(x->headers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar5._M_node == p_Var11) {
    pcVar10 = "";
  }
  else {
    pcVar10 = *(char **)(cVar5._M_node + 2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1110,pcVar10,(allocator<char> *)local_1038);
  local_10d0 = progress;
  iVar3 = std::__cxx11::string::compare((char *)local_1110);
  if (local_1110[0] != (key_type *)local_1100) {
    operator_delete(local_1110[0],(ulong)(local_1100._0_8_ + 1));
  }
  if (iVar3 == 0) {
    iVar3 = 0x19f;
  }
  else {
    local_1110[0] = (key_type *)0x11;
    local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
    local_1038[0]._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)local_1038,(ulong)local_1110);
    local_1038[0].field_2._M_allocated_capacity = local_1110[0];
    *(undefined8 *)local_1038[0]._M_dataplus._M_p = 0x726566736e617254;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 8) = '-';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 9) = 'E';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 10) = 'n';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 0xb) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 0xc) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 0xd) = 'd';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 0xe) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1038[0]._M_dataplus._M_p + 0xf) = 'n';
    local_1038[0]._M_dataplus._M_p[0x10] = 'g';
    local_1038[0]._M_string_length = (size_type)local_1110[0];
    local_1038[0]._M_dataplus._M_p[(long)local_1110[0]] = '\0';
    cVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this->_M_t,local_1038);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1038[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_1038[0]._M_dataplus._M_p,
                      (ulong)(local_1038[0].field_2._M_allocated_capacity + 1));
    }
    if ((_Rb_tree_header *)cVar5._M_node == p_Var11) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)(cVar5._M_node + 2);
    }
    iVar3 = strcasecmp(pcVar10,"chunked");
    if (iVar3 == 0) {
      std::function<bool_(const_char_*,_unsigned_long)>::function
                ((function<bool_(const_char_*,_unsigned_long)> *)&local_1058,
                 (function<bool_(const_char_*,_unsigned_long)> *)(local_1100 + 0x10));
      bVar2 = read_content_chunked((detail *)strm,(Stream *)&local_1058,out);
      if (local_1048 != (code *)0x0) {
        (*local_1048)(&local_1058,&local_1058,__destroy_functor);
      }
    }
    else {
      local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"Content-Length","");
      cVar5 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&this->_M_t,local_1038);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1038[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1038[0]._M_dataplus._M_p,
                        (ulong)(local_1038[0].field_2._M_allocated_capacity + 1));
      }
      if ((_Rb_tree_header *)cVar5._M_node == p_Var11) {
        std::function<bool_(const_char_*,_unsigned_long)>::function
                  ((function<bool_(const_char_*,_unsigned_long)> *)&local_1078,
                   (function<bool_(const_char_*,_unsigned_long)> *)(local_1100 + 0x10));
        do {
          uVar4 = (*strm->_vptr_Stream[2])(strm,local_1038,0x1000);
          if ((int)uVar4 < 0) break;
          if (uVar4 == 0) {
            bVar2 = true;
            goto LAB_00162e8d;
          }
          local_1118 = (key_type *)(ulong)uVar4;
          local_1110[0] = local_1038;
          if (local_1068 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          bVar2 = (*local_1060)(&local_1078,(char **)local_1110,(unsigned_long *)&local_1118);
        } while (bVar2);
        bVar2 = false;
LAB_00162e8d:
        if (local_1068 != (code *)0x0) {
          (*local_1068)(&local_1078,&local_1078,__destroy_functor);
        }
      }
      else {
        local_1038[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"Content-Length","");
        cVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&this->_M_t,local_1038);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1038[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1038[0]._M_dataplus._M_p,
                          (ulong)(local_1038[0].field_2._M_allocated_capacity + 1));
        }
        bVar8 = true;
        if ((_Rb_tree_header *)cVar5._M_node == p_Var11) goto LAB_00162efd;
        pkVar6 = (key_type *)strtoull(*(char **)(cVar5._M_node + 2),(char **)0x0,10);
        if (local_10c8 < pkVar6) {
          pkVar12 = (key_type *)0x0;
          do {
            uVar7 = (long)pkVar6 - (long)pkVar12;
            if (pkVar6 < pkVar12 || uVar7 == 0) break;
            if (0xfff < uVar7) {
              uVar7 = 0x1000;
            }
            uVar4 = (*strm->_vptr_Stream[2])(strm,local_1038,uVar7);
            pkVar12 = (key_type *)((long)&(pkVar12->_M_dataplus)._M_p + (ulong)uVar4);
          } while (0 < (int)uVar4);
          iVar3 = 0x19d;
          goto LAB_00162ef4;
        }
        if (pkVar6 == (key_type *)0x0) goto LAB_00162efd;
        std::function<bool_(unsigned_long,_unsigned_long)>::function
                  ((function<bool_(unsigned_long,_unsigned_long)> *)&local_1098,local_10d0);
        std::function<bool_(const_char_*,_unsigned_long)>::function
                  ((function<bool_(const_char_*,_unsigned_long)> *)&local_10b8,
                   (function<bool_(const_char_*,_unsigned_long)> *)(local_1100 + 0x10));
        pkVar12 = (key_type *)0x0;
        do {
          uVar7 = (long)pkVar6 - (long)pkVar12;
          if (0xfff < uVar7) {
            uVar7 = 0x1000;
          }
          uVar4 = (*strm->_vptr_Stream[2])(strm,local_1038,uVar7);
          if ((int)uVar4 < 1) {
LAB_00162eae:
            bVar2 = false;
            goto LAB_00162eb0;
          }
          pkVar9 = (key_type *)(ulong)uVar4;
          local_1118 = pkVar9;
          local_1110[0] = local_1038;
          if (local_10a8 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          bVar2 = (*local_10a0)(&local_10b8,(char **)local_1110,(unsigned_long *)&local_1118);
          if (!bVar2) goto LAB_00162eae;
          pkVar12 = (key_type *)
                    ((long)&(pkVar12->_M_dataplus)._M_p + (long)&(pkVar9->_M_dataplus)._M_p);
          if (local_1088 != (code *)0x0) {
            local_1118 = pkVar6;
            local_1110[0] = pkVar12;
            bVar2 = (*local_1080)(&local_1098,(unsigned_long *)local_1110,
                                  (unsigned_long *)&local_1118);
            if (!bVar2) goto LAB_00162eae;
          }
        } while (pkVar12 < pkVar6);
        bVar2 = true;
LAB_00162eb0:
        if (local_10a8 != (code *)0x0) {
          (*local_10a8)(&local_10b8,&local_10b8,__destroy_functor);
        }
        if (local_1088 != (code *)0x0) {
          (*local_1088)(&local_1098,&local_1098,__destroy_functor);
        }
      }
    }
    iVar3 = 400;
    bVar8 = true;
    if (bVar2 != false) goto LAB_00162efd;
  }
LAB_00162ef4:
  *local_10c0 = iVar3;
  bVar8 = false;
LAB_00162efd:
  if (local_10e0 != (code *)0x0) {
    (*local_10e0)((_Any_data *)(local_1100 + 0x10),(_Any_data *)(local_1100 + 0x10),
                  __destroy_functor);
  }
  return bVar8;
}

Assistant:

bool read_content(Stream &strm, T &x, size_t payload_max_length, int &status,
                  Progress progress, ContentReceiver receiver) {

  ContentReceiver out = [&](const char *buf, size_t n) {
    return receiver(buf, n);
  };

#ifdef CPPHTTPLIB_ZLIB_SUPPORT
  detail::decompressor decompressor;

  if (!decompressor.is_valid()) {
    status = 500;
    return false;
  }

  if (x.get_header_value("Content-Encoding") == "gzip") {
    out = [&](const char *buf, size_t n) {
      return decompressor.decompress(
          buf, n, [&](const char *buf, size_t n) { return receiver(buf, n); });
    };
  }
#else
  if (x.get_header_value("Content-Encoding") == "gzip") {
    status = 415;
    return false;
  }
#endif

  auto ret = true;
  auto exceed_payload_max_length = false;

  if (is_chunked_transfer_encoding(x.headers)) {
    ret = read_content_chunked(strm, out);
  } else if (!has_header(x.headers, "Content-Length")) {
    ret = read_content_without_length(strm, out);
  } else {
    auto len = get_header_value_uint64(x.headers, "Content-Length", 0);
    if (len > payload_max_length) {
      exceed_payload_max_length = true;
      skip_content_with_length(strm, len);
      ret = false;
    } else if (len > 0) {
      ret = read_content_with_length(strm, len, progress, out);
    }
  }

  if (!ret) { status = exceed_payload_max_length ? 413 : 400; }

  return ret;
}